

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar3;
  uint uVar4;
  double *pdVar5;
  FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar6;
  ulong uVar7;
  value_type vVar8;
  double dVar9;
  double dVar10;
  
  pFVar6 = (fadexpr->fadexpr_).left_;
  uVar4 = ((*(Fad<double> **)((long)&(((pFVar6->fadexpr_).left_)->fadexpr_).expr_.fadexpr_ + 0x10))
          ->dx_).num_elts;
  uVar1 = (((((pFVar6->fadexpr_).right_)->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_0141890b;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_0141890b;
    }
    if (uVar2 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar6 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar7 = (ulong)uVar1 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar7);
    (this->dx_).ptr_to_data = pdVar5;
    uVar4 = ((*(Fad<double> **)((long)&(((pFVar6->fadexpr_).left_)->fadexpr_).expr_.fadexpr_ + 0x10)
             )->dx_).num_elts;
  }
  if ((uVar4 == 0) ||
     ((((((pFVar6->fadexpr_).right_)->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        vVar8 = FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                ::dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar7);
        pdVar5[uVar7] = vVar8 * (fadexpr->fadexpr_).right_.constant_;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      vVar8 = FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
              ::fastAccessDx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar7);
      pdVar5[uVar7] = vVar8 * (fadexpr->fadexpr_).right_.constant_;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
LAB_0141890b:
  pFVar6 = (fadexpr->fadexpr_).left_;
  pFVar3 = (pFVar6->fadexpr_).left_;
  dVar9 = sin((pFVar3->fadexpr_).expr_.fadexpr_.left_.constant_ *
              (*(Fad<double> **)((long)&(pFVar3->fadexpr_).expr_.fadexpr_ + 0x10))->val_);
  pFVar3 = (pFVar6->fadexpr_).right_;
  dVar10 = sin((pFVar3->fadexpr_).expr_.fadexpr_.left_.constant_ *
               ((pFVar3->fadexpr_).expr_.fadexpr_.right_)->val_);
  this->val_ = dVar10 * dVar9 * (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}